

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decisiontree.cpp
# Opt level: O1

DtreeNode * __thiscall
DecisionTree::buildTree
          (DecisionTree *this,DtreeNode *node,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *valRange)

{
  double dVar1;
  pointer pvVar2;
  DtreeNode *pDVar3;
  _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>> *this_00;
  vector<double,_std::allocator<double>_> *data;
  pointer __x;
  pair<int,_double> pVar4;
  set<double,_std::less<double>,_std::allocator<double>_> cls_right;
  set<double,_std::less<double>,_std::allocator<double>_> cls_left;
  _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  local_90;
  _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  local_60;
  
  if ((node == (DtreeNode *)0x0) || (*(long *)&this->features == *(long *)&this->field_0xc8)) {
    return (DtreeNode *)0x0;
  }
  pVar4 = createSplitFeature(this,valRange);
  node->axis = pVar4.first;
  node->splitVal = pVar4.second;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (valRange->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (valRange->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__x != pvVar2) {
    do {
      dVar1 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[node->axis];
      if ((dVar1 != node->splitVal) || (NAN(dVar1) || NAN(node->splitVal))) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&node->rightTreeVal,__x);
        this_00 = (_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                   *)&local_90;
      }
      else {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&node->leftTreeVal,__x);
        this_00 = (_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                   *)&local_60;
      }
      std::_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>::
      _M_insert_unique<double_const&>
                (this_00,(__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish + -1);
      __x = __x + 1;
    } while (__x != pvVar2);
  }
  if (local_60._M_impl.super__Rb_tree_header._M_node_count < 2) {
    pDVar3 = (DtreeNode *)operator_new(0x70);
    pDVar3->splitVal = 0.0;
    pDVar3->isLeaf = false;
    (pDVar3->leafValue).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pDVar3->leafValue).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pDVar3->leafValue).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(pDVar3->leafValue).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    (pDVar3->leftTreeVal).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pDVar3->leftTreeVal).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pDVar3->leftTreeVal).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pDVar3->rightTreeVal).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pDVar3->rightTreeVal).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pDVar3->rightTreeVal).
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar3->left = (DtreeNode *)0x0;
    pDVar3->right = (DtreeNode *)0x0;
    node->left = pDVar3;
    pDVar3->isLeaf = true;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)pDVar3,&node->leftTreeVal);
LAB_00103ed4:
    if (local_90._M_impl.super__Rb_tree_header._M_node_count < 2) {
      pDVar3 = (DtreeNode *)operator_new(0x70);
      pDVar3->splitVal = 0.0;
      pDVar3->isLeaf = false;
      (pDVar3->leafValue).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->leafValue).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pDVar3->leafValue).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&(pDVar3->leafValue).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pDVar3->left = (DtreeNode *)0x0;
      pDVar3->right = (DtreeNode *)0x0;
      node->right = pDVar3;
      pDVar3->isLeaf = true;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)pDVar3,&node->rightTreeVal);
    }
    else {
      if ((node->rightTreeVal).
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (node->rightTreeVal).
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00103fa0;
      pDVar3 = (DtreeNode *)operator_new(0x70);
      pDVar3->splitVal = 0.0;
      pDVar3->isLeaf = false;
      (pDVar3->leafValue).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->leafValue).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pDVar3->leafValue).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&(pDVar3->leafValue).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pDVar3->left = (DtreeNode *)0x0;
      pDVar3->right = (DtreeNode *)0x0;
      node->right = pDVar3;
      pDVar3 = buildTree(this,pDVar3,&node->rightTreeVal);
      node->right = pDVar3;
    }
    if ((node->right == (DtreeNode *)0x0) && (node->left == (DtreeNode *)0x0)) {
      node->isLeaf = true;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&node->leafValue,valRange);
    }
  }
  else {
    if ((node->leftTreeVal).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (node->leftTreeVal).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pDVar3 = (DtreeNode *)operator_new(0x70);
      pDVar3->splitVal = 0.0;
      pDVar3->isLeaf = false;
      (pDVar3->leafValue).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->leafValue).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pDVar3->leafValue).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&(pDVar3->leafValue).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar3->leftTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar3->rightTreeVal).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pDVar3->left = (DtreeNode *)0x0;
      pDVar3->right = (DtreeNode *)0x0;
      node->left = pDVar3;
      pDVar3 = buildTree(this,pDVar3,&node->leftTreeVal);
      node->left = pDVar3;
      goto LAB_00103ed4;
    }
LAB_00103fa0:
    node = (DtreeNode *)0x0;
  }
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree(&local_90);
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree(&local_60);
  return node;
}

Assistant:

DtreeNode* DecisionTree::buildTree(DtreeNode* node, vector<vector<double >>& valRange) {
    if (!node)
        return nullptr;
    if (features.empty())
        return nullptr;
    pair<int, double> splitFeatureAndValue = createSplitFeature(valRange);
    node->axis = splitFeatureAndValue.first;
    node->splitVal = splitFeatureAndValue.second;
    set<double> cls_left;
    set<double> cls_right;
    for (const auto& data : valRange){
        if (data[node->axis] == node->splitVal) {
            node->leftTreeVal.push_back(data);
            cls_left.insert(data.back());
        }
        else {
            node->rightTreeVal.push_back(data);
            cls_right.insert(data.back());
        }
    }
    if (cls_left.size()<=1){//belong to the same class
        node->left = new DtreeNode();
        node->left->isLeaf = true;
        node->left->leafValue = node->leftTreeVal;
    }
    else if (!node->leftTreeVal.empty()) {
        node->left = new DtreeNode();
        node->left = buildTree(node->left, node->leftTreeVal);
    } else{
        return nullptr;
    }
    if (cls_right.size()<=1){//belong to the same class
        node->right = new DtreeNode();
        node->right->isLeaf = true;
        node->right->leafValue = node->rightTreeVal;
    }
    else if (!node->rightTreeVal.empty()){
        node->right = new DtreeNode();
        node->right = buildTree(node->right, node->rightTreeVal);
    } else{
        return nullptr;
    }
    if (!node->right&&!node->left){
        node->isLeaf=true;
        node->leafValue = valRange;
    }
    return node;
}